

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O1

void __thiscall Rml::ElementStyle::UpdateDefinition(ElementStyle *this)

{
  _WordT *p_Var1;
  StyleSheetNode *this_00;
  ElementDefinition *this_01;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  int iVar5;
  size_t __i_2;
  undefined4 extraout_var;
  PropertyIdSet *pPVar6;
  PropertyIdSet *pPVar7;
  Property *this_03;
  Property *other;
  size_t __i;
  long lVar8;
  PropertyId id;
  size_t __position;
  SharedPtr<const_ElementDefinition> new_definition;
  bitset<128UL> __result;
  PropertyIdSet changed_properties;
  PropertyIdSet properties_in_both_definitions;
  _Head_base<0UL,_Rml::StyleSheetNode_*,_false> local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  undefined1 local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  PropertyIdSet local_58;
  bitset<128UL> local_40;
  
  local_78._M_head_impl = (StyleSheetNode *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar5 = (*(this->element->super_ScriptInterface).super_Releasable._vptr_Releasable[4])();
  if ((Element *)CONCAT44(extraout_var,iVar5) != (Element *)0x0) {
    StyleSheet::GetElementDefinition((StyleSheet *)local_68,(Element *)CONCAT44(extraout_var,iVar5))
    ;
    p_Var3 = p_Stack_60;
    local_78._M_head_impl = (StyleSheetNode *)local_68;
    this_02._M_pi = _Stack_70._M_pi;
    local_68 = (undefined1  [8])0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_70._M_pi = p_Var3;
    if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
    }
    if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
    }
  }
  this_00 = (StyleSheetNode *)
            (this->definition).
            super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_78._M_head_impl == this_00) goto LAB_0022f768;
  local_58.defined_ids.super__Base_bitset<2UL>._M_w[0] = 0;
  local_58.defined_ids.super__Base_bitset<2UL>._M_w[1] = 0;
  if (this_00 != (StyleSheetNode *)0x0) {
    pPVar6 = ElementDefinition::GetPropertyIds((ElementDefinition *)this_00);
    local_58.defined_ids.super__Base_bitset<2UL>._M_w[0] =
         (pPVar6->defined_ids).super__Base_bitset<2UL>._M_w[0];
    local_58.defined_ids.super__Base_bitset<2UL>._M_w[1] =
         (pPVar6->defined_ids).super__Base_bitset<2UL>._M_w[1];
  }
  if (local_78._M_head_impl != (StyleSheetNode *)0x0) {
    pPVar6 = ElementDefinition::GetPropertyIds((ElementDefinition *)local_78._M_head_impl);
    lVar8 = 0;
    do {
      p_Var1 = local_58.defined_ids.super__Base_bitset<2UL>._M_w + lVar8;
      *p_Var1 = *p_Var1 | (pPVar6->defined_ids).super__Base_bitset<2UL>._M_w[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
  }
  this_01 = (this->definition).
            super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((this_01 != (ElementDefinition *)0x0) && (local_78._M_head_impl != (StyleSheetNode *)0x0)) {
    pPVar6 = ElementDefinition::GetPropertyIds(this_01);
    pPVar7 = ElementDefinition::GetPropertyIds((ElementDefinition *)local_78._M_head_impl);
    local_68 = (undefined1  [8])(pPVar6->defined_ids).super__Base_bitset<2UL>._M_w[0];
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (pPVar6->defined_ids).super__Base_bitset<2UL>._M_w[1];
    lVar8 = 0;
    do {
      *(ulong *)(local_68 + lVar8 * 8) =
           *(ulong *)(local_68 + lVar8 * 8) &
           (pPVar7->defined_ids).super__Base_bitset<2UL>._M_w[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    local_40.super__Base_bitset<2UL>._M_w[0] = (_WordT)local_68;
    local_40.super__Base_bitset<2UL>._M_w[1] = (_WordT)p_Stack_60;
    if ((_Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_>)local_68
        == (StyleSheetNode *)0x0) {
      bVar4 = true;
      do {
        bVar2 = bVar4;
        if (!bVar2) break;
        bVar4 = false;
      } while (p_Stack_60 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
      __position = 0x80;
      if (bVar2) goto LAB_0022f659;
    }
    else {
LAB_0022f659:
      __position = 1;
      do {
        bVar4 = ::std::bitset<128UL>::test(&local_40,__position);
        if (bVar4) goto LAB_0022f685;
        __position = __position + 1;
      } while (__position != 0x80);
      __position = 0x80;
    }
LAB_0022f685:
    if (__position != 0x80) {
      do {
        id = (PropertyId)__position;
        this_03 = ElementDefinition::GetProperty
                            ((this->definition).
                             super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,id);
        other = ElementDefinition::GetProperty((ElementDefinition *)local_78._M_head_impl,id);
        if ((other != (Property *)0x0 && this_03 != (Property *)0x0) &&
           (this_03->unit == other->unit)) {
          bVar4 = Variant::operator==(&this_03->value,&other->value);
          if (bVar4) {
            PropertyIdSet::Erase(&local_58,id);
          }
        }
        __position = __position + 1;
        if (__position < 0x80) {
          do {
            bVar4 = ::std::bitset<128UL>::test(&local_40,__position);
            if (bVar4) goto LAB_0022f717;
            __position = __position + 1;
          } while (__position != 0x80);
          __position = 0x80;
        }
LAB_0022f717:
      } while (__position != 0x80);
    }
    TransitionPropertyChanges
              (this->element,&local_58,&this->inline_properties,
               (this->definition).
               super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (ElementDefinition *)local_78._M_head_impl);
  }
  (this->definition).super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_78._M_head_impl;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->definition).
              super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&_Stack_70);
  lVar8 = 0;
  do {
    p_Var1 = (this->dirty_properties).defined_ids.super__Base_bitset<2UL>._M_w + lVar8;
    *p_Var1 = *p_Var1 | local_58.defined_ids.super__Base_bitset<2UL>._M_w[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 == 1);
LAB_0022f768:
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  return;
}

Assistant:

void ElementStyle::UpdateDefinition()
{
	RMLUI_ZoneScoped;

	SharedPtr<const ElementDefinition> new_definition;

	if (const StyleSheet* style_sheet = element->GetStyleSheet())
	{
		new_definition = style_sheet->GetElementDefinition(element);
	}

	// Switch the property definitions if the definition has changed.
	if (new_definition != definition)
	{
		PropertyIdSet changed_properties;

		if (definition)
			changed_properties = definition->GetPropertyIds();

		if (new_definition)
			changed_properties |= new_definition->GetPropertyIds();

		if (definition && new_definition)
		{
			// Remove properties that compare equal from the changed list.
			const PropertyIdSet properties_in_both_definitions = (definition->GetPropertyIds() & new_definition->GetPropertyIds());

			for (PropertyId id : properties_in_both_definitions)
			{
				const Property* p0 = definition->GetProperty(id);
				const Property* p1 = new_definition->GetProperty(id);
				if (p0 && p1 && *p0 == *p1)
					changed_properties.Erase(id);
			}

			// Transition changed properties if transition property is set
			TransitionPropertyChanges(element, changed_properties, inline_properties, definition.get(), new_definition.get());
		}

		definition = new_definition;

		DirtyProperties(changed_properties);
	}
}